

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QPoint __thiscall QWidget::mapFrom(QWidget *this,QWidget *parent,QPoint *pos)

{
  ulong uVar1;
  undefined4 in_ECX;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  QPointF QVar6;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.xp = (qreal)(*pos).xp.m_i;
  local_18.yp = (qreal)(*pos).yp.m_i;
  QVar6 = mapFrom(this,parent,&local_18);
  auVar5._0_8_ = (double)((ulong)QVar6.yp & 0x8000000000000000 | 0x3fe0000000000000) + QVar6.yp;
  auVar5._8_8_ = (double)((ulong)QVar6.xp & 0x8000000000000000 | 0x3fe0000000000000) + QVar6.xp;
  auVar5 = minpd(_DAT_0066f5d0,auVar5);
  auVar4._8_8_ = -(ulong)(-2147483648.0 < auVar5._8_8_);
  auVar4._0_8_ = -(ulong)(-2147483648.0 < auVar5._0_8_);
  uVar2 = movmskpd(in_ECX,auVar4);
  uVar1 = 0x8000000000000000;
  if ((uVar2 & 1) != 0) {
    uVar1 = (ulong)(uint)(int)auVar5._0_8_ << 0x20;
  }
  uVar3 = 0x80000000;
  if ((uVar2 & 2) != 0) {
    uVar3 = (ulong)(uint)(int)auVar5._8_8_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QPoint)(uVar1 | uVar3);
  }
  __stack_chk_fail();
}

Assistant:

QPoint QWidget::mapFrom(const QWidget *parent, const QPoint &pos) const
{
    return mapFrom(parent, QPointF(pos)).toPoint();
}